

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<Base64Test_DecodeBase64_Test>::CreateTest
          (ParameterizedTestFactory<Base64Test_DecodeBase64_Test> *this)

{
  Test *this_00;
  ParameterizedTestFactory<Base64Test_DecodeBase64_Test> *this_local;
  
  WithParamInterface<Base64TestVector>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x18);
  Base64Test_DecodeBase64_Test::Base64Test_DecodeBase64_Test
            ((Base64Test_DecodeBase64_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }